

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBucket::SnailAlloc
          (LargeHeapBucket *this,Recycler *recycler,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,bool nothrow)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *pcVar4;
  ConfigFlagsTable *pCVar5;
  int local_70;
  BOOL collected;
  char *memBlock;
  bool nothrow_local;
  ObjectInfoBits attributes_local;
  size_t size_local;
  size_t sizeCat_local;
  Recycler *recycler_local;
  LargeHeapBucket *this_local;
  
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x40,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((recycler->disableCollectOnAllocationHeuristics & 1U) == 0) {
    local_70 = Recycler::CollectNow<(Memory::CollectionFlags)404819971>(recycler);
  }
  else {
    local_70 = Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(recycler);
  }
  if (local_70 == 0) {
    pcVar4 = TryAllocFromNewHeapBlock(this,recycler,sizeCat,size,attributes,nothrow);
    if (pcVar4 != (char *)0x0) {
      return pcVar4;
    }
    pCVar5 = Recycler::GetRecyclerFlagsTable(recycler);
    if ((pCVar5->Verbose & 1U) != 0) {
      pCVar5 = Recycler::GetRecyclerFlagsTable(recycler);
      bVar2 = Js::Phases::IsEnabled(&pCVar5->Trace,MemoryAllocationPhase);
      if (bVar2) {
        Output::Print(L"LargeHeapBucket::AddLargeHeapBlock failed, forcing in-thread collection\n");
      }
    }
    Recycler::CollectNow<(Memory::CollectionFlags)16384>(recycler);
  }
  this_local = (LargeHeapBucket *)TryAlloc(this,recycler,sizeCat,attributes);
  if ((this_local == (LargeHeapBucket *)0x0) &&
     (this_local = (LargeHeapBucket *)
                   TryAllocFromNewHeapBlock(this,recycler,sizeCat,size,attributes,nothrow),
     this_local == (LargeHeapBucket *)0x0)) {
    if (!nothrow) {
      Recycler::OutOfMemory(recycler);
    }
    this_local = (LargeHeapBucket *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char *
LargeHeapBucket::SnailAlloc(Recycler * recycler, size_t sizeCat, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    char * memBlock;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    // No free memory, try to collect with allocated bytes and time heuristic, and concurrently
#if ENABLE_CONCURRENT_GC
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? recycler->FinishConcurrent<FinishConcurrentOnAllocation>() :
        recycler->CollectNow<CollectOnAllocation>();
#else
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? FALSE : recycler->CollectNow<CollectOnAllocation>();
#endif

    if (!collected)
    {
        memBlock = TryAllocFromNewHeapBlock(recycler, sizeCat, size, attributes, nothrow);
        if (memBlock != nullptr)
        {
            return memBlock;
        }
        // Can't even allocate a new block, we need force a collection and
        // allocate some free memory, add a new heap block again, or throw out of memory
        AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("LargeHeapBucket::AddLargeHeapBlock failed, forcing in-thread collection\n"));
        recycler->CollectNow<CollectNowForceInThread>();
    }

    memBlock = TryAlloc(recycler, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    memBlock = TryAllocFromNewHeapBlock(recycler, sizeCat, size, attributes, nothrow);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    if (nothrow == false)
    {
        // Can't add a heap block, we are out of memory
        // Since nothrow is false, we can throw right here
        recycler->OutOfMemory();
    }

    return nullptr;
}